

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void * phmap::priv::
       Allocate<8ul,std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>
                 (scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
                  *alloc,size_t n)

{
  undefined1 local_38 [16];
  void *p;
  A mem_alloc;
  size_t n_local;
  scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
  *alloc_local;
  
  mem_alloc._8_8_ = n;
  if (n == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0x105d,
                  "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<const unsigned long, std::vector<unsigned long, boost::interprocess::allocator<unsigned long, boost::interprocess::segment_manager<char, boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family>, boost::interprocess::iset_index>>>>, boost::interprocess::segment_manager<char, boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family>, boost::interprocess::iset_index>>>]"
                 );
  }
  std::
  scoped_allocator_adaptor<boost::interprocess::allocator<phmap::priv::Allocate<8ul,std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>(std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>*,unsigned_long)::M,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
  ::
  scoped_allocator_adaptor<std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>&,void>
            ((scoped_allocator_adaptor<boost::interprocess::allocator<phmap::priv::Allocate<8ul,std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>(std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>*,unsigned_long)::M,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
              *)&p,alloc);
  allocator_traits<std::scoped_allocator_adaptor<boost::interprocess::allocator<M,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>
  ::allocate((scoped_allocator_adaptor<boost::interprocess::allocator<M,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
              *)local_38,(size_type)&p);
  local_38._8_8_ =
       boost::interprocess::offset_ptr<M,_long,_unsigned_long,_0UL>::operator*
                 ((offset_ptr<M,_long,_unsigned_long,_0UL> *)local_38);
  if ((local_38._8_8_ & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % Alignment == 0 && \"allocator does not respect alignment\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0x1064,
                  "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<const unsigned long, std::vector<unsigned long, boost::interprocess::allocator<unsigned long, boost::interprocess::segment_manager<char, boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family>, boost::interprocess::iset_index>>>>, boost::interprocess::segment_manager<char, boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family>, boost::interprocess::iset_index>>>]"
                 );
  }
  return (reference)local_38._8_8_;
}

Assistant:

void* Allocate(Alloc* alloc, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  struct alignas(Alignment) M {};
  using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
  A mem_alloc(*alloc);
  void* p = &*AT::allocate(mem_alloc, (n + sizeof(M) - 1) / sizeof(M)); // `&*` to support custom pointers such as boost offset_ptr.
  assert(reinterpret_cast<uintptr_t>(p) % Alignment == 0 &&
         "allocator does not respect alignment");
  return p;
}